

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O1

Aig_Man_t * Aig_ManRemap(Aig_Man_t *p,Vec_Ptr_t *vMap)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  Aig_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  Aig_Obj_t *pAVar11;
  Vec_Ptr_t *pVVar12;
  ulong uVar13;
  ulong uVar14;
  Aig_Obj_t *p1;
  long lVar15;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pName = pcVar8;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pSpec = pcVar8;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  pVVar2 = p->vFlopNums;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->nSize != p->nRegs) {
      __assert_fail("p->vFlopNums == NULL || Vec_IntSize(p->vFlopNums) == p->nRegs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                    ,0x3a,"Aig_Man_t *Aig_ManRemap(Aig_Man_t *, Vec_Ptr_t *)");
    }
    if (pVVar2 != (Vec_Int_t *)0x0) {
      pVVar9 = (Vec_Int_t *)malloc(0x10);
      iVar6 = pVVar2->nSize;
      lVar15 = (long)iVar6;
      pVVar9->nSize = iVar6;
      pVVar9->nCap = iVar6;
      if (lVar15 == 0) {
        piVar10 = (int *)0x0;
      }
      else {
        piVar10 = (int *)malloc(lVar15 * 4);
      }
      pVVar9->pArray = piVar10;
      memcpy(piVar10,pVVar2->pArray,lVar15 << 2);
      p_00->vFlopNums = pVVar9;
    }
  }
  pVVar2 = p->vFlopReprs;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    iVar6 = pVVar2->nSize;
    lVar15 = (long)iVar6;
    pVVar9->nSize = iVar6;
    pVVar9->nCap = iVar6;
    if (lVar15 == 0) {
      piVar10 = (int *)0x0;
    }
    else {
      piVar10 = (int *)malloc(lVar15 * 4);
    }
    pVVar9->pArray = piVar10;
    memcpy(piVar10,pVVar2->pArray,lVar15 << 2);
    p_00->vFlopReprs = pVVar9;
  }
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar12 = p->vCis;
  if (0 < pVVar12->nSize) {
    lVar15 = 0;
    do {
      pvVar3 = pVVar12->pArray[lVar15];
      pAVar11 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar11;
      lVar15 = lVar15 + 1;
      pVVar12 = p->vCis;
    } while (lVar15 < pVVar12->nSize);
  }
  uVar5 = p->nObjs[2] - p->nRegs;
  if ((p->vFlopReprs != (Vec_Int_t *)0x0) && (pVVar12 = p->vCis, (int)uVar5 < pVVar12->nSize)) {
    lVar15 = 0;
    do {
      if ((int)uVar5 < 0) goto LAB_0063dae1;
      if (p->vFlopNums->nSize <= lVar15) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      *(long *)pVVar12->pArray[(ulong)uVar5 + lVar15] = (long)p->vFlopNums->pArray[lVar15];
      pVVar12 = p->vCis;
      lVar15 = lVar15 + 1;
    } while ((int)((int)lVar15 + uVar5) < pVVar12->nSize);
  }
  pVVar12 = p->vCis;
  if (0 < pVVar12->nSize) {
    lVar15 = 0;
    do {
      if (vMap->nSize <= lVar15) goto LAB_0063dae1;
      piVar10 = (int *)vMap->pArray[lVar15];
      piVar4 = (int *)pVVar12->pArray[lVar15];
      *(ulong *)(piVar4 + 10) =
           (ulong)((uint)piVar10 & 1) ^ *(ulong *)(((ulong)piVar10 & 0xfffffffffffffffe) + 0x28);
      if (((p_00->vFlopReprs != (Vec_Int_t *)0x0) && ((int)uVar5 <= lVar15)) && (piVar4 != piVar10))
      {
        if (0xfffffffd < (piVar4[6] & 7U) - 7) {
LAB_0063db1f:
          __assert_fail("!Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
        }
        Vec_IntPush(p_00->vFlopReprs,*piVar4);
        iVar6 = -1;
        if ((*(uint *)(((ulong)piVar10 & 0xfffffffffffffffe) + 0x18) & 7) != 1) {
          if (((ulong)piVar10 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObjMapped)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                          ,0x56,"Aig_Man_t *Aig_ManRemap(Aig_Man_t *, Vec_Ptr_t *)");
          }
          if ((piVar10[6] & 7U) != 2) {
            __assert_fail("Aig_ObjIsCi(pObjMapped)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                          ,0x57,"Aig_Man_t *Aig_ManRemap(Aig_Man_t *, Vec_Ptr_t *)");
          }
          if (0xfffffffd < (piVar4[6] & 7U) - 7) goto LAB_0063db1f;
          iVar6 = *piVar10;
          if (*piVar4 == iVar6) {
            __assert_fail("Aig_ObjCioId(pObj) != Aig_ObjCioId(pObjMapped)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                          ,0x58,"Aig_Man_t *Aig_ManRemap(Aig_Man_t *, Vec_Ptr_t *)");
          }
        }
        Vec_IntPush(p_00->vFlopReprs,iVar6);
      }
      lVar15 = lVar15 + 1;
      pVVar12 = p->vCis;
    } while (lVar15 < pVVar12->nSize);
  }
  if (p->vFlopReprs != (Vec_Int_t *)0x0) {
    uVar5 = p->nObjs[2] - p->nRegs;
    pVVar12 = p->vCis;
    if ((int)uVar5 < pVVar12->nSize) {
      uVar14 = (ulong)uVar5;
      do {
        if ((int)uVar5 < 0) {
LAB_0063dae1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        *(undefined8 *)pVVar12->pArray[uVar14] = 0;
        uVar14 = uVar14 + 1;
        pVVar12 = p->vCis;
      } while ((int)uVar14 < pVVar12->nSize);
    }
  }
  pVVar12 = p->vObjs;
  if (0 < pVVar12->nSize) {
    lVar15 = 0;
    do {
      pvVar3 = pVVar12->pArray[lVar15];
      if (pvVar3 != (void *)0x0) {
        uVar5 = (uint)*(undefined8 *)((long)pvVar3 + 0x18);
        if ((uVar5 & 7) == 4) {
          if (((ulong)pvVar3 & 1) != 0) goto LAB_0063db00;
          uVar14 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
          if (uVar14 == 0) {
            pAVar11 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar11 = (Aig_Obj_t *)
                      ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar14 + 0x28));
          }
        }
        else {
          if ((uVar5 & 7) - 7 < 0xfffffffe) goto LAB_0063da28;
          if (((ulong)pvVar3 & 1) != 0) goto LAB_0063db00;
          uVar14 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
          if (uVar14 == 0) {
            pAVar11 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar11 = (Aig_Obj_t *)
                      ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar14 + 0x28));
          }
          uVar14 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
          if (uVar14 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) ^ *(ulong *)(uVar14 + 0x28));
          }
          pAVar11 = Aig_And(p_00,pAVar11,p1);
        }
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar11;
      }
LAB_0063da28:
      lVar15 = lVar15 + 1;
      pVVar12 = p->vObjs;
    } while (lVar15 < pVVar12->nSize);
  }
  pVVar12 = p->vCos;
  if (0 < pVVar12->nSize) {
    lVar15 = 0;
    do {
      if (((ulong)pVVar12->pArray[lVar15] & 1) != 0) {
LAB_0063db00:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar14 = *(ulong *)((long)pVVar12->pArray[lVar15] + 8);
      uVar13 = uVar14 & 0xfffffffffffffffe;
      if (uVar13 == 0) {
        pAVar11 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar11 = (Aig_Obj_t *)((ulong)((uint)uVar14 & 1) ^ *(ulong *)(uVar13 + 0x28));
      }
      Aig_ObjCreateCo(p_00,pAVar11);
      lVar15 = lVar15 + 1;
      pVVar12 = p->vCos;
    } while (lVar15 < pVVar12->nSize);
  }
  if (p_00->nObjs[6] + p_00->nObjs[5] <= p->nObjs[6] + p->nObjs[5]) {
    Aig_ManSetRegNum(p_00,p->nRegs);
    iVar6 = Aig_ManCheck(p_00);
    if (iVar6 == 0) {
      puts("Aig_ManRemap(): The check has failed.");
    }
    return p_00;
  }
  __assert_fail("Aig_ManNodeNum(p) >= Aig_ManNodeNum(pNew)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                ,0x6b,"Aig_Man_t *Aig_ManRemap(Aig_Man_t *, Vec_Ptr_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Remaps the manager.]

  Description [Map in the array specifies for each CI node the node that
  should be used after remapping.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Aig_ManRemap( Aig_Man_t * p, Vec_Ptr_t * vMap )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjMapped;
    int i, nTruePis;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    assert( p->vFlopNums == NULL || Vec_IntSize(p->vFlopNums) == p->nRegs );
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    if ( p->vFlopReprs )
        pNew->vFlopReprs = Vec_IntDup( p->vFlopReprs );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
    // implement the mapping
    nTruePis = Aig_ManCiNum(p)-Aig_ManRegNum(p);
    if ( p->vFlopReprs )
    {
        Aig_ManForEachLoSeq( p, pObj, i )
            pObj->pNext = (Aig_Obj_t *)(long)Vec_IntEntry( p->vFlopNums, i-nTruePis );
    }
    Aig_ManForEachCi( p, pObj, i )
    {
        pObjMapped = (Aig_Obj_t *)Vec_PtrEntry( vMap, i );
        pObj->pData = Aig_NotCond( (Aig_Obj_t *)Aig_Regular(pObjMapped)->pData, Aig_IsComplement(pObjMapped) );
        if ( pNew->vFlopReprs && i >= nTruePis && pObj != pObjMapped )
        {
            Vec_IntPush( pNew->vFlopReprs, Aig_ObjCioId(pObj) );
            if ( Aig_ObjIsConst1( Aig_Regular(pObjMapped) ) )
                Vec_IntPush( pNew->vFlopReprs, -1 );
            else
            {
                assert( !Aig_IsComplement(pObjMapped) );
                assert( Aig_ObjIsCi(pObjMapped) );
                assert( Aig_ObjCioId(pObj) != Aig_ObjCioId(pObjMapped) );
                Vec_IntPush( pNew->vFlopReprs, Aig_ObjCioId(pObjMapped) );
            }
        }
    }
    if ( p->vFlopReprs )
    {
        Aig_ManForEachLoSeq( p, pObj, i )
            pObj->pNext = NULL;
    }
    // duplicate internal nodes
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        else if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add the POs
    Aig_ManForEachCo( p, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    assert( Aig_ManNodeNum(p) >= Aig_ManNodeNum(pNew) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManRemap(): The check has failed.\n" );
    return pNew;
}